

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void PredictorSub12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  unkuint9 Var46;
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  unkuint9 Var49;
  undefined1 auVar50 [11];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  long lVar57;
  long lVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  
  lVar57 = 0;
  lVar58 = 0;
  while (lVar58 + 4 <= (long)num_pixels) {
    auVar3 = *(undefined1 (*) [16])((long)in + lVar57 + -4);
    pcVar1 = (char *)((long)in + lVar57);
    cVar27 = pcVar1[1];
    cVar28 = pcVar1[2];
    cVar29 = pcVar1[3];
    cVar30 = pcVar1[4];
    cVar31 = pcVar1[5];
    cVar32 = pcVar1[6];
    cVar33 = pcVar1[7];
    cVar34 = pcVar1[8];
    cVar35 = pcVar1[9];
    cVar36 = pcVar1[10];
    cVar37 = pcVar1[0xb];
    cVar38 = pcVar1[0xc];
    cVar39 = pcVar1[0xd];
    cVar40 = pcVar1[0xe];
    cVar41 = pcVar1[0xf];
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar3._0_13_;
    auVar6[0xe] = auVar3[7];
    auVar9[0xc] = auVar3[6];
    auVar9._0_12_ = auVar3._0_12_;
    auVar9._13_2_ = auVar6._13_2_;
    auVar12[0xb] = 0;
    auVar12._0_11_ = auVar3._0_11_;
    auVar12._12_3_ = auVar9._12_3_;
    auVar15[10] = auVar3[5];
    auVar15._0_10_ = auVar3._0_10_;
    auVar15._11_4_ = auVar12._11_4_;
    auVar18[9] = 0;
    auVar18._0_9_ = auVar3._0_9_;
    auVar18._10_5_ = auVar15._10_5_;
    auVar21[8] = auVar3[4];
    auVar21._0_8_ = auVar3._0_8_;
    auVar21._9_6_ = auVar18._9_6_;
    auVar42._7_8_ = 0;
    auVar42._0_7_ = auVar21._8_7_;
    Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),auVar3[3]);
    auVar51._9_6_ = 0;
    auVar51._0_9_ = Var43;
    auVar44._1_10_ = SUB1510(auVar51 << 0x30,5);
    auVar44[0] = auVar3[2];
    auVar52._11_4_ = 0;
    auVar52._0_11_ = auVar44;
    auVar24[2] = auVar3[1];
    auVar24._0_2_ = auVar3._0_2_;
    auVar24._3_12_ = SUB1512(auVar52 << 0x20,3);
    auVar4 = *(undefined1 (*) [16])((long)upper + lVar57 + -4);
    auVar5 = *(undefined1 (*) [16])((long)upper + lVar57);
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar5._0_13_;
    auVar7[0xe] = auVar5[7];
    auVar10[0xc] = auVar5[6];
    auVar10._0_12_ = auVar5._0_12_;
    auVar10._13_2_ = auVar7._13_2_;
    auVar13[0xb] = 0;
    auVar13._0_11_ = auVar5._0_11_;
    auVar13._12_3_ = auVar10._12_3_;
    auVar16[10] = auVar5[5];
    auVar16._0_10_ = auVar5._0_10_;
    auVar16._11_4_ = auVar13._11_4_;
    auVar19[9] = 0;
    auVar19._0_9_ = auVar5._0_9_;
    auVar19._10_5_ = auVar16._10_5_;
    auVar22[8] = auVar5[4];
    auVar22._0_8_ = auVar5._0_8_;
    auVar22._9_6_ = auVar19._9_6_;
    auVar45._7_8_ = 0;
    auVar45._0_7_ = auVar22._8_7_;
    Var46 = CONCAT81(SUB158(auVar45 << 0x40,7),auVar5[3]);
    auVar53._9_6_ = 0;
    auVar53._0_9_ = Var46;
    auVar47._1_10_ = SUB1510(auVar53 << 0x30,5);
    auVar47[0] = auVar5[2];
    auVar54._11_4_ = 0;
    auVar54._0_11_ = auVar47;
    auVar25[2] = auVar5[1];
    auVar25._0_2_ = auVar5._0_2_;
    auVar25._3_12_ = SUB1512(auVar54 << 0x20,3);
    auVar8[0xd] = 0;
    auVar8._0_13_ = auVar4._0_13_;
    auVar8[0xe] = auVar4[7];
    auVar11[0xc] = auVar4[6];
    auVar11._0_12_ = auVar4._0_12_;
    auVar11._13_2_ = auVar8._13_2_;
    auVar14[0xb] = 0;
    auVar14._0_11_ = auVar4._0_11_;
    auVar14._12_3_ = auVar11._12_3_;
    auVar17[10] = auVar4[5];
    auVar17._0_10_ = auVar4._0_10_;
    auVar17._11_4_ = auVar14._11_4_;
    auVar20[9] = 0;
    auVar20._0_9_ = auVar4._0_9_;
    auVar20._10_5_ = auVar17._10_5_;
    auVar23[8] = auVar4[4];
    auVar23._0_8_ = auVar4._0_8_;
    auVar23._9_6_ = auVar20._9_6_;
    auVar48._7_8_ = 0;
    auVar48._0_7_ = auVar23._8_7_;
    Var49 = CONCAT81(SUB158(auVar48 << 0x40,7),auVar4[3]);
    auVar55._9_6_ = 0;
    auVar55._0_9_ = Var49;
    auVar50._1_10_ = SUB1510(auVar55 << 0x30,5);
    auVar50[0] = auVar4[2];
    auVar56._11_4_ = 0;
    auVar56._0_11_ = auVar50;
    auVar26[2] = auVar4[1];
    auVar26._0_2_ = auVar4._0_2_;
    auVar26._3_12_ = SUB1512(auVar56 << 0x20,3);
    sVar67 = ((auVar5._0_2_ & 0xff) + (auVar3._0_2_ & 0xff)) - (auVar4._0_2_ & 0xff);
    sVar68 = (auVar25._2_2_ + auVar24._2_2_) - auVar26._2_2_;
    sVar69 = (auVar47._0_2_ + auVar44._0_2_) - auVar50._0_2_;
    sVar70 = ((short)Var46 + (short)Var43) - (short)Var49;
    sVar71 = (auVar22._8_2_ + auVar21._8_2_) - auVar23._8_2_;
    sVar72 = (auVar16._10_2_ + auVar15._10_2_) - auVar17._10_2_;
    sVar73 = (auVar10._12_2_ + auVar9._12_2_) - auVar11._12_2_;
    sVar74 = ((auVar7._13_2_ >> 8) + (auVar6._13_2_ >> 8)) - (auVar8._13_2_ >> 8);
    sVar59 = ((ushort)auVar5[8] + (ushort)auVar3[8]) - (ushort)auVar4[8];
    sVar60 = ((ushort)auVar5[9] + (ushort)auVar3[9]) - (ushort)auVar4[9];
    sVar61 = ((ushort)auVar5[10] + (ushort)auVar3[10]) - (ushort)auVar4[10];
    sVar62 = ((ushort)auVar5[0xb] + (ushort)auVar3[0xb]) - (ushort)auVar4[0xb];
    sVar63 = ((ushort)auVar5[0xc] + (ushort)auVar3[0xc]) - (ushort)auVar4[0xc];
    sVar64 = ((ushort)auVar5[0xd] + (ushort)auVar3[0xd]) - (ushort)auVar4[0xd];
    sVar65 = ((ushort)auVar5[0xe] + (ushort)auVar3[0xe]) - (ushort)auVar4[0xe];
    sVar66 = ((ushort)auVar5[0xf] + (ushort)auVar3[0xf]) - (ushort)auVar4[0xf];
    pcVar2 = (char *)((long)out + lVar57);
    *pcVar2 = *pcVar1 - ((0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67));
    pcVar2[1] = cVar27 - ((0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68));
    pcVar2[2] = cVar28 - ((0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69));
    pcVar2[3] = cVar29 - ((0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70));
    pcVar2[4] = cVar30 - ((0 < sVar71) * (sVar71 < 0x100) * (char)sVar71 - (0xff < sVar71));
    pcVar2[5] = cVar31 - ((0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72));
    pcVar2[6] = cVar32 - ((0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73));
    pcVar2[7] = cVar33 - ((0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74));
    pcVar2[8] = cVar34 - ((0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59));
    pcVar2[9] = cVar35 - ((0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60));
    pcVar2[10] = cVar36 - ((0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61));
    pcVar2[0xb] = cVar37 - ((0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62));
    pcVar2[0xc] = cVar38 - ((0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63));
    pcVar2[0xd] = cVar39 - ((0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64));
    pcVar2[0xe] = cVar40 - ((0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65));
    pcVar2[0xf] = cVar41 - ((0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66));
    lVar57 = lVar57 + 0x10;
    lVar58 = lVar58 + 4;
  }
  if (num_pixels == (int)lVar58) {
    return;
  }
  (*VP8LPredictorsSub_C[0xc])
            ((uint32_t *)((long)in + lVar57),(uint32_t *)((long)upper + lVar57),
             num_pixels - (int)lVar58,(uint32_t *)((long)out + lVar57));
  return;
}

Assistant:

static void PredictorSub12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    const __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    const __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    const __m128i pred_lo = _mm_add_epi16(L_lo, diff_lo);
    const __m128i pred_hi = _mm_add_epi16(L_hi, diff_hi);
    const __m128i pred = _mm_packus_epi16(pred_lo, pred_hi);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}